

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::TypeSpecializeStElem(GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal)

{
  Opnd *pOVar1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  bool bVar5;
  ObjectType OVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  BailOutKind BVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *pJVar12;
  FunctionJITTimeInfo *pFVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  long lVar17;
  undefined7 uVar18;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 uVar19;
  IndirOpnd *indirOpnd;
  ValueType *this_00;
  Instr *this_01;
  char16_t *pcVar20;
  Sym *pSVar21;
  int local_1c8 [2];
  char baseValueTypeStr [256];
  char16 debugStringBuffer [42];
  int local_5c [2];
  int32 src1IntConstantValue;
  char16_t *local_50;
  Sym *local_48;
  BailOutKind local_3c;
  undefined4 local_38;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType baseValueType;
  
  pOVar1 = (*pInstr)->m_dst;
  OVar3 = IR::Opnd::GetKind(pOVar1);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_00467e2b;
    *puVar11 = 0;
  }
  local_32[0] = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pOVar1[1]._vptr_Opnd + 1);
  bVar4 = IR::Instr::DoStackArgsOpt(*pInstr);
  if ((((bVar4) ||
       ((bVar4 = DoTypedArrayTypeSpec(this->func), !bVar4 &&
        (bVar4 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), bVar4)))
       ) || ((bVar4 = DoNativeArrayTypeSpec(this->func), !bVar4 &&
             (bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), bVar4))))
     || ((bVar4 = ValueType::IsLikelyOptimizedTypedArray((ValueType *)&local_32[0].field_0), !bVar4
         && (bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0), !bVar4)))) {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar7,uVar8);
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar7,uVar8);
    if (!bVar4) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1c8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    bVar4 = IR::Instr::DoStackArgsOpt(*pInstr);
    pcVar20 = 
    L"typed array type specialization is disabled, or base is not an optimized typed array";
    if (bVar4) {
      pcVar20 = L"instruction uses the arguments object";
    }
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"
                  ,pcVar14,pcVar15,pcVar16,(char (*) [256])local_1c8,pcVar20);
LAB_0046704d:
    Output::Flush();
    return false;
  }
  OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if ((OVar3 != OpndKindReg) &&
     ((src1Val == (Value *)0x0 ||
      (bVar4 = ValueInfo::HasIntConstantValue(src1Val->valueInfo,false), !bVar4)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2ae9,
                       "(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()))"
                       ,
                       "instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue())"
                      );
    if (!bVar4) goto LAB_00467e2b;
    *puVar11 = 0;
  }
  OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if (OVar3 == OpndKindReg) {
    pOVar1 = (*pInstr)->m_src1;
    OVar3 = IR::Opnd::GetKind(pOVar1);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_00467e2b;
      *puVar11 = 0;
    }
    pSVar21 = (Sym *)pOVar1[1]._vptr_Opnd;
  }
  else {
    pSVar21 = (Sym *)0x0;
  }
  if (pSVar21 != (Sym *)0x0) {
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    bVar5 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,pSVar21);
    if (bVar4) {
      if (!bVar5) {
        if (src1Val != (Value *)0x0) {
          this_00 = &src1Val->valueInfo->super_ValueType;
          if ((this->field_0xf5 & 2) == 0) {
            bVar4 = ValueType::IsInt(this_00);
          }
          else {
            bVar4 = ValueType::IsLikelyInt(this_00);
          }
          if (bVar4 != false) goto LAB_0046740d;
        }
        bVar4 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar21)
        ;
        if (((!bVar4) &&
            ((src1Val == (Value *)0x0 ||
             (bVar4 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType), !bVar4)))) ||
           (bVar4 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0), bVar4)) {
          return false;
        }
      }
    }
    else if ((!bVar5) &&
            (bVar4 = GlobOptBlockData::IsFloat64TypeSpecialized
                               (&this->currentBlock->globOptData,pSVar21), !bVar4)) {
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar7,uVar8);
      if (bVar4) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Didn\'t specialize array access, because src is not type specialized.\n");
        IR::Instr::Dump(*pInstr);
        Output::Flush();
      }
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar7,uVar8);
      if (!bVar4) {
        return false;
      }
      ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1c8);
      pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
      pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                          (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
      pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"
                    ,pcVar14,pcVar15,pcVar16,(char (*) [256])local_1c8);
      goto LAB_0046704d;
    }
  }
LAB_0046740d:
  local_48 = pSVar21;
  bVar4 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_32[0].field_0);
  if (((src1Val != (Value *)0x0 && bVar4) &&
      (bVar4 = ValueInfo::TryGetIntConstantValue(src1Val->valueInfo,local_5c,false), bVar4)) &&
     (local_5c[0] == -0x7fffe)) {
    return false;
  }
  OVar3 = IR::Opnd::GetKind((*pInstr)->m_dst);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2b2a,"(instr->GetDst()->IsIndirOpnd())","instr->GetDst()->IsIndirOpnd()");
    if (!bVar4) goto LAB_00467e2b;
    *puVar11 = 0;
  }
  indirOpnd = (IndirOpnd *)(*pInstr)->m_dst;
  OVar3 = IR::Opnd::GetKind((Opnd *)indirOpnd);
  if (OVar3 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_00467e2b;
    *puVar11 = 0;
  }
  ToVarUses(this,*pInstr,(Opnd *)indirOpnd,true,(Value *)0x0);
  bVar4 = ShouldExpectConventionalArrayIndexValue(this,indirOpnd);
  pSVar21 = local_48;
  if (!bVar4) {
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar7,uVar8);
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t specialize array access, because index is negative or likely not int.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar7,uVar8);
    if (!bVar4) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1c8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    pcVar20 = 
    L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"
    ;
    goto LAB_00467d02;
  }
  OVar6 = ValueType::GetObjectType((ValueType *)&local_32[0].field_0);
  uVar9 = OVar6 - 5;
  if (uVar9 < 0x1b) {
    BVar10 = BailOutConventionalTypedArrayAccessOnly;
    local_38 = (undefined4)CONCAT71((int7)((ulong)indirOpnd >> 8),1);
    lVar17 = (long)&switchD_00467578::switchdataD_01000c9c +
             (long)(int)(&switchD_00467578::switchdataD_01000c9c)[uVar9];
    switch((uint)OVar6) {
    default:
      goto switchD_00467578_caseD_5;
    case 7:
    case 0x10:
    case 0x19:
      local_3c = BailOutConventionalTypedArrayAccessOnly;
      if ((pSVar21 != (Sym *)0x0) &&
         (bVar4 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,pSVar21)
         , !bVar4)) {
        bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar21)
        ;
        uVar19 = 0x17;
        if (bVar5) {
          uVar19 = 10;
        }
        local_48 = (Sym *)CONCAT44(local_48._4_4_,uVar19);
        local_38 = 1;
        goto LAB_00467967;
      }
      local_48 = (Sym *)CONCAT44(local_48._4_4_,3);
      local_38 = 0;
      goto LAB_004675a7;
    case 0xb:
    case 0x14:
    case 0x1d:
      local_3c = BailOutConventionalTypedArrayAccessOnly;
      if (pSVar21 != (Sym *)0x0) {
        bVar4 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,pSVar21);
        if (bVar4) {
          local_48 = (Sym *)CONCAT44(local_48._4_4_,3);
          local_38 = 1;
          goto LAB_004675a7;
        }
        local_38 = (undefined4)CONCAT71(extraout_var,1);
        bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized(&this->currentBlock->globOptData,pSVar21)
        ;
        bVar4 = !bVar5;
        goto LAB_00467957;
      }
      local_50 = L"int32";
      stack0xffffffffffffffa8 = 1;
      local_48 = (Sym *)CONCAT44(local_48._4_4_,3);
      bVar5 = true;
      local_38 = 1;
      break;
    case 0xc:
    case 0xd:
    case 0x15:
    case 0x16:
    case 0x1e:
    case 0x1f:
switchD_00467578_caseD_c:
      bVar5 = (bool)((this->field_0xf5 & 0x20) >> 5);
      bVar4 = bVar5 == false;
      local_3c = BVar10;
LAB_00467957:
      uVar19 = 0x17;
      if (!bVar4) {
        uVar19 = 10;
      }
      local_48 = (Sym *)CONCAT44(local_48._4_4_,uVar19);
LAB_00467967:
      stack0xffffffffffffffa8 = 2;
      local_50 = L"float64";
    }
  }
  else {
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_32[0].field_0);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2b8f,"(baseValueType.IsLikelyNativeArray())",
                         "baseValueType.IsLikelyNativeArray()");
      if (!bVar4) goto LAB_00467e2b;
      *puVar11 = 0;
    }
    bVar4 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    lVar17 = CONCAT71(extraout_var_00,bVar4);
    if (!bVar4) {
      bVar4 = ValueType::HasFloatElements((ValueType *)&local_32[0].field_0);
      BVar10 = BailOutConventionalNativeArrayAccessOnly;
      if (bVar4) {
        local_38 = 0;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2b96,"(baseValueType.HasFloatElements())",
                           "baseValueType.HasFloatElements()");
        if (!bVar4) goto LAB_00467e2b;
        *puVar11 = 0;
        local_38 = 0;
        BVar10 = BailOutConventionalNativeArrayAccessOnly;
      }
      goto switchD_00467578_caseD_c;
    }
    BVar10 = BailOutConventionalNativeArrayAccessOnly;
    local_38 = 0;
switchD_00467578_caseD_5:
    uVar18 = (undefined7)((ulong)lVar17 >> 8);
    local_3c = BVar10;
    if ((this->field_0xf5 & 0x22) == 0) {
      local_48 = (Sym *)CONCAT44(local_48._4_4_,(int)CONCAT71(uVar18,0x17));
      stack0xffffffffffffffa8 = 2;
      local_50 = L"float64";
      bVar5 = false;
    }
    else {
      local_48 = (Sym *)CONCAT44(local_48._4_4_,(int)CONCAT71(uVar18,3));
LAB_004675a7:
      local_50 = L"int32";
      stack0xffffffffffffffa8 = 1;
      bVar5 = true;
    }
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar7,uVar8);
  if (bVar5 == false) {
    if (bVar4) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(
                   L"Didn\'t specialize array access, because the source was not already specialized.\n"
                   );
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar7,uVar8);
    if (!bVar4) {
      return false;
    }
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1c8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    pcVar20 = 
    L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"
    ;
LAB_00467d02:
    Output::Print(pcVar20,pcVar14,pcVar15,pcVar16,local_1c8);
    Output::Flush();
    return false;
  }
  if (bVar4) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized array access.\n");
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
  pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar13);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TypedArrayTypeSpecPhase,uVar7,uVar8);
  if (bVar4) {
    ValueType::ToString((ValueType *)&local_32[0].field_0,(char (*) [256])local_1c8);
    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar12);
    pFVar13 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    pcVar15 = FunctionJITTimeInfo::GetDebugNumberSet
                        (pFVar13,(wchar (*) [42])(baseValueTypeStr + 0xf8));
    pcVar16 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    Output::Print(L"Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"
                  ,pcVar14,pcVar15,pcVar16,local_1c8);
    Output::Flush();
  }
  ToTypeSpecUse(this,*pInstr,(*pInstr)->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,
                (IRType)local_48,(BailOutKind)stack0xffffffffffffffa8,local_38._0_1_,(Instr *)0x0);
  if (this->prePassLoop != (Loop *)0x0) {
    return bVar5;
  }
  if (((*pInstr)->m_opcode == StElemC) &&
     (bVar4 = ValueType::IsObject((ValueType *)&local_32[0].field_0), bVar4)) {
    bVar4 = ValueType::HasIntElements((ValueType *)&local_32[0].field_0);
    if (!bVar4) {
      return bVar5;
    }
    local_1c8[0] = -0x80000000;
    baseValueTypeStr[0xf8] = -1;
    baseValueTypeStr[0xf9] = -1;
    baseValueTypeStr[0xfa] = -1;
    baseValueTypeStr[0xfb] = '\x7f';
    bVar4 = ValueInfo::GetIntValMinMax
                      (src1Val->valueInfo,local_1c8,(int *)(baseValueTypeStr + 0xf8),false);
    if (bVar4) {
      if (-0x7fffe < local_1c8[0]) {
        return bVar5;
      }
      if ((int)baseValueTypeStr._248_4_ < -0x7fffe) {
        return bVar5;
      }
    }
  }
  if (((*pInstr)->field_0x38 & 0x10) == 0) {
    GenerateBailAtOperation(this,pInstr,local_3c);
    return bVar5;
  }
  BVar10 = IR::Instr::GetBailOutKind(*pInstr);
  if ((((BVar10 & ~BailOutKindBits) != BailOutOnImplicitCallsPreOp) &&
      ((BVar10 & ~BailOutKindBits) != BailOutInvalid)) ||
     ((BVar10 & (LazyBailOut|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                 BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                 BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                 BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                BailOutOnResultConditions)) != BailOutInvalid)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2bcf,
                       "(( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)))"
                       ,
                       "( !(oldBailOutKind & ~IR::BailOutKindBits) || (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp ) && !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject))"
                      );
    if (!bVar4) goto LAB_00467e2b;
    *puVar11 = 0;
  }
  if (local_3c != BailOutConventionalNativeArrayAccessOnly) {
    if (local_3c == BailOutConventionalTypedArrayAccessOnly) {
      this_01 = *pInstr;
      BVar10 = BVar10 & (BailOutMisc|BailOutOnDivSrcConditions|BailOutForDebuggerBits|
                         BailOnStackArgsOutOfActualsRange|BailOutOnInvalidatedArrayLength|
                         BailOutOnInvalidatedArrayHeadSegment|BailOutConvertedNativeArray|
                         BailOutConventionalNativeArrayAccessOnly|BailOutOnMissingValue|
                        BailOutOnResultConditions) | BailOutConventionalTypedArrayAccessOnly;
      goto LAB_00467e1e;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2bdc,"(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly)",
                       "arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly");
    if (!bVar4) {
LAB_00467e2b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar11 = 0;
  }
  this_01 = *pInstr;
  BVar10 = BVar10 | local_3c;
LAB_00467e1e:
  IR::Instr::SetBailOutKind(this_01,BVar10);
  return bVar5;
}

Assistant:

bool
GlobOpt::TypeSpecializeStElem(IR::Instr ** pInstr, Value *src1Val, Value **pDstVal)
{
    IR::Instr *&instr = *pInstr;

    IR::RegOpnd *baseOpnd = instr->GetDst()->AsIndirOpnd()->GetBaseOpnd();
    ValueType baseValueType(baseOpnd->GetValueType());
    if (instr->DoStackArgsOpt() ||
        (!this->DoTypedArrayTypeSpec() && baseValueType.IsLikelyOptimizedTypedArray()) ||
        (!this->DoNativeArrayTypeSpec() && baseValueType.IsLikelyNativeArray()) ||
        !(baseValueType.IsLikelyOptimizedTypedArray() || baseValueType.IsLikelyNativeArray()))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't type specialize array access, because typed array type specialization is disabled, or base is not an optimized typed array.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                instr->DoStackArgsOpt() ?
                    _u("instruction uses the arguments object") :
                    _u("typed array type specialization is disabled, or base is not an optimized typed array"));
            Output::Flush();
        }
        return false;
    }

    Assert(instr->GetSrc1()->IsRegOpnd() || (src1Val && src1Val->GetValueInfo()->HasIntConstantValue()));

    StackSym *sym = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd()->m_sym : nullptr;

    // Only type specialize the source of store element if the source symbol is already type specialized to int or float.
    if (sym)
    {
        if (baseValueType.IsLikelyNativeArray())
        {
            // Gently coerce these src's into native if it seems likely to work.
            // Otherwise we can't use the fast path to store.
            // But don't try to put a float-specialized number into an int array this way.
            if (!(
                    CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
                    (
                        src1Val &&
                        (
                            DoAggressiveIntTypeSpec()
                                ? src1Val->GetValueInfo()->IsLikelyInt()
                                : src1Val->GetValueInfo()->IsInt()
                        )
                    )
                ))
            {
                if (!(
                        CurrentBlockData()->IsFloat64TypeSpecialized(sym) ||
                        (src1Val && src1Val->GetValueInfo()->IsLikelyNumber())
                    ) ||
                    baseValueType.HasIntElements())
                {
                    return false;
                }
            }
        }
        else if (!CurrentBlockData()->IsInt32TypeSpecialized(sym) && !CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because src is not type specialized.\n"));
            if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
                baseValueType.ToString(baseValueTypeStr);
                Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because src is not specialized.\n"),
                              this->func->GetJITFunctionBody()->GetDisplayName(),
                              this->func->GetDebugNumberSet(debugStringBuffer),
                              Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                              baseValueTypeStr);
                Output::Flush();
            }

            return false;
        }
    }

    int32 src1IntConstantValue;
    if(baseValueType.IsLikelyNativeIntArray() && src1Val && src1Val->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue))
    {
        if(Js::SparseArraySegment<int32>::IsMissingItem(&src1IntConstantValue))
        {
            return false;
        }
    }

    // Note: doing ToVarUses to make sure we do get the int32 version of the index before trying to access its value in
    // ShouldExpectConventionalArrayIndexValue. Not sure why that never gave us a problem before.
    Assert(instr->GetDst()->IsIndirOpnd());
    IR::IndirOpnd *dst = instr->GetDst()->AsIndirOpnd();

    // Make sure we use the int32 version of the index operand symbol, if available.  Otherwise, ensure the var symbol is live (by
    // potentially inserting a ToVar).
    this->ToVarUses(instr, dst, /* isDst = */ true, nullptr);

    if (!ShouldExpectConventionalArrayIndexValue(dst))
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because index is negative or likely not int.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not specialize because index is negative or likely not int.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
        return false;
    }

    IRType          toType = TyVar;
    bool            isLossyAllowed = true;
    IR::BailOutKind arrayBailOutKind = IR::BailOutConventionalTypedArrayAccessOnly;

    switch(baseValueType.GetObjectType())
    {
    case ObjectType::Int8Array:
    case ObjectType::Uint8Array:
    case ObjectType::Int16Array:
    case ObjectType::Uint16Array:
    case ObjectType::Int32Array:
    case ObjectType::Int8VirtualArray:
    case ObjectType::Uint8VirtualArray:
    case ObjectType::Int16VirtualArray:
    case ObjectType::Uint16VirtualArray:
    case ObjectType::Int32VirtualArray:
    case ObjectType::Int8MixedArray:
    case ObjectType::Uint8MixedArray:
    case ObjectType::Int16MixedArray:
    case ObjectType::Uint16MixedArray:
    case ObjectType::Int32MixedArray:
    Int32Array:
        if (this->DoAggressiveIntTypeSpec() || this->DoFloatTypeSpec())
        {
            toType = TyInt32;
        }
        break;

    case ObjectType::Uint32Array:
    case ObjectType::Uint32VirtualArray:
    case ObjectType::Uint32MixedArray:
        // Uint32Arrays may store values that overflow int32.  If the value being stored comes from a symbol that's
        // already losslessly type specialized to int32, we'll use it.  Otherwise, if we only have a float64 specialized
        // value, we don't want to force bailout if it doesn't fit in int32.  Instead, we'll emit conversion in the
        // lowerer, and handle overflow, if necessary.
        if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
        {
            toType = TyInt32;
        }
        else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
        {
            toType = TyFloat64;
        }
        break;

    case ObjectType::Float32Array:
    case ObjectType::Float64Array:
    case ObjectType::Float32VirtualArray:
    case ObjectType::Float32MixedArray:
    case ObjectType::Float64VirtualArray:
    case ObjectType::Float64MixedArray:
    Float64Array:
    if (this->DoFloatTypeSpec())
    {
         toType = TyFloat64;
    }
    break;

    case ObjectType::Uint8ClampedArray:
    case ObjectType::Uint8ClampedVirtualArray:
    case ObjectType::Uint8ClampedMixedArray:
        // Uint8ClampedArray requires rounding (as opposed to truncation) of floating point values. If source symbol is
        // float type specialized, type specialize this instruction to float as well, and handle rounding in the
        // lowerer.
            if (!sym || CurrentBlockData()->IsInt32TypeSpecialized(sym))
            {
                toType = TyInt32;
                isLossyAllowed = false;
            }
            else if (CurrentBlockData()->IsFloat64TypeSpecialized(sym))
            {
                toType = TyFloat64;
            }
        break;

    default:
        Assert(baseValueType.IsLikelyNativeArray());
        isLossyAllowed = false;
        arrayBailOutKind = IR::BailOutConventionalNativeArrayAccessOnly;
        if(baseValueType.HasIntElements())
        {
            goto Int32Array;
        }
        Assert(baseValueType.HasFloatElements());
        goto Float64Array;
    }

    if (toType != TyVar)
    {
        GOPT_TRACE_INSTR(instr, _u("Type specialized array access.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, type specialized to %s.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr,
                toType == TyInt32 ? _u("int32") : _u("float64"));
            Output::Flush();
        }

        IR::BailOutKind bailOutKind = ((toType == TyInt32) ? IR::BailOutIntOnly : IR::BailOutNumberOnly);
        this->ToTypeSpecUse(instr, instr->GetSrc1(), this->currentBlock, src1Val, nullptr, toType, bailOutKind, /* lossy = */ isLossyAllowed);

        if (!this->IsLoopPrePass())
        {
            bool bConvertToBailoutInstr = true;
            // Definite StElemC doesn't need bailout, because it can't fail or cause conversion.
            if (instr->m_opcode == Js::OpCode::StElemC && baseValueType.IsObject())
            {
                if (baseValueType.HasIntElements())
                {
                    //Native int array requires a missing element check & bailout
                    int32 min = INT32_MIN;
                    int32 max = INT32_MAX;

                    if (src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, false))
                    {
                        bConvertToBailoutInstr = ((min <= Js::JavascriptNativeIntArray::MissingItem) && (max >= Js::JavascriptNativeIntArray::MissingItem));
                    }
                }
                else
                {
                    bConvertToBailoutInstr = false;
                }
            }

            if (bConvertToBailoutInstr)
            {
                if(instr->HasBailOutInfo())
                {
                    const IR::BailOutKind oldBailOutKind = instr->GetBailOutKind();
                    Assert(
                        (
                            !(oldBailOutKind & ~IR::BailOutKindBits) ||
                            (oldBailOutKind & ~IR::BailOutKindBits) == IR::BailOutOnImplicitCallsPreOp
                        ) &&
                        !(oldBailOutKind & IR::BailOutKindBits & ~(IR::BailOutOnArrayAccessHelperCall | IR::BailOutMarkTempObject)));
                    if(arrayBailOutKind == IR::BailOutConventionalTypedArrayAccessOnly)
                    {
                        // BailOutConventionalTypedArrayAccessOnly also bails out if the array access is outside the head
                        // segment bounds, and guarantees no implicit calls. Override the bailout kind so that the instruction
                        // bails out for the right reason.
                        instr->SetBailOutKind(
                            arrayBailOutKind | (oldBailOutKind & (IR::BailOutKindBits - IR::BailOutOnArrayAccessHelperCall)));
                    }
                    else
                    {
                        // BailOutConventionalNativeArrayAccessOnly by itself may generate a helper call, and may cause implicit
                        // calls to occur, so it must be merged in to eliminate generating the helper call.
                        Assert(arrayBailOutKind == IR::BailOutConventionalNativeArrayAccessOnly);
                        instr->SetBailOutKind(oldBailOutKind | arrayBailOutKind);
                    }
                }
                else
                {
                    GenerateBailAtOperation(&instr, arrayBailOutKind);
                }
            }
        }
    }
    else
    {
        GOPT_TRACE_INSTR(instr, _u("Didn't specialize array access, because the source was not already specialized.\n"));
        if (PHASE_TRACE(Js::TypedArrayTypeSpecPhase, this->func))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            char baseValueTypeStr[VALUE_TYPE_MAX_STRING_SIZE];
            baseValueType.ToString(baseValueTypeStr);
            Output::Print(_u("Typed Array Optimization:  function: %s (%s): instr: %s, base value type: %S, did not type specialize, because of array type.\n"),
                this->func->GetJITFunctionBody()->GetDisplayName(),
                this->func->GetDebugNumberSet(debugStringBuffer),
                Js::OpCodeUtil::GetOpCodeName(instr->m_opcode),
                baseValueTypeStr);
            Output::Flush();
        }
    }

    return toType != TyVar;
}